

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule.hpp
# Opt level: O1

rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>
* __thiscall
boost::spirit::classic::
rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>
::operator=(rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>
            *this,action<boost::spirit::classic::action<boost::spirit::classic::real_parser<double,_boost::spirit::classic::real_parser_policies<double>_>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLastParsedElement>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
                  *p)

{
  pointer pcVar1;
  long *plVar2;
  ParserPOMDPFormat_Spirit *pPVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x38);
  *puVar4 = &PTR__concrete_parser_005cf088;
  pPVar3 = (p->
           super_unary<boost::spirit::classic::action<boost::spirit::classic::real_parser<double,_boost::spirit::classic::real_parser_policies<double>_>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLastParsedElement>,_boost::spirit::classic::parser<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::real_parser<double,_boost::spirit::classic::real_parser_policies<double>_>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLastParsedElement>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>_>_>
           ).subj.actor._m_po;
  puVar4[1] = *(undefined8 *)
               &(p->
                super_unary<boost::spirit::classic::action<boost::spirit::classic::real_parser<double,_boost::spirit::classic::real_parser_policies<double>_>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLastParsedElement>,_boost::spirit::classic::parser<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::real_parser<double,_boost::spirit::classic::real_parser_policies<double>_>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLastParsedElement>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>_>_>
                ).subj;
  puVar4[2] = pPVar3;
  puVar4[3] = puVar4 + 5;
  pcVar1 = (p->actor).s._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar4 + 3),pcVar1,pcVar1 + (p->actor).s._M_string_length);
  plVar2 = *(long **)this;
  *(undefined8 **)this = puVar4;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  return (rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>
          *)this;
}

Assistant:

rule& operator=(ParserT const& p)
        {
            ptr.reset(new impl::concrete_parser<ParserT, scanner_t, attr_t>(p));
            return *this;
        }